

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

ssize_t __thiscall
soplex::SPxLPBase<double>::read(SPxLPBase<double> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  char *pcVar3;
  undefined8 in_R8;
  char c;
  bool ok;
  undefined1 local_39;
  char local_2a;
  undefined8 uVar2;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  std::istream::get(pcVar3);
  std::istream::putback((char)__fd);
  if ((local_2a == '*') || (local_2a == 'N')) {
    iVar1 = (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1d])
                      (this,pcVar3,__buf,__nbytes,in_R8);
    uVar2 = CONCAT44(extraout_var,iVar1);
    local_39 = (undefined1)iVar1;
  }
  else {
    iVar1 = (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1c])
                      (this,pcVar3,__buf,__nbytes,in_R8);
    uVar2 = CONCAT44(extraout_var_00,iVar1);
    local_39 = (undefined1)iVar1;
  }
  return CONCAT71((int7)((ulong)uVar2 >> 8),local_39) & 0xffffffffffffff01;
}

Assistant:

virtual bool read(std::istream& in, NameSet* rowNames = nullptr, NameSet* colNames = nullptr,
                     DIdxSet* intVars  = nullptr)
   {
      bool ok;
      char c;

      in.get(c);
      in.putback(c);

      /* MPS starts either with a comment mark '*' or with the keyword 'NAME' at the first column.  LPF starts either
       * with blanks, a comment mark '\' or with the keyword "MAX" or "MIN" in upper or lower case.  There is no
       * possible valid LPF file starting with a '*' or 'N'.
       */
      ok = ((c == '*') || (c == 'N'))
           ? readMPS(in, rowNames, colNames, intVars)
           : readLPF(in, rowNames, colNames, intVars);

      return ok;
   }